

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O2

_Bool mi_bitmap_is_claimedx
                (mi_bitmap_t bitmap,size_t bitmap_fields,size_t count,mi_bitmap_index_t bitmap_idx,
                _Bool *any_ones)

{
  ulong uVar1;
  ulong uVar2;
  
  if (bitmap_fields < 0x40) {
    if (bitmap_fields == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = ~(-1L << ((byte)bitmap_fields & 0x3f)) << ((byte)count & 0x3f);
    }
  }
  else {
    uVar2 = 0xffffffffffffffff;
  }
  uVar1 = bitmap[count >> 6];
  if (bitmap_idx != 0) {
    *(bool *)bitmap_idx = (uVar1 & uVar2) != 0;
  }
  return (uVar1 & uVar2) == uVar2;
}

Assistant:

static bool mi_bitmap_is_claimedx(mi_bitmap_t bitmap, size_t bitmap_fields, size_t count, mi_bitmap_index_t bitmap_idx, bool* any_ones) {
  const size_t idx = mi_bitmap_index_field(bitmap_idx);
  const size_t bitidx = mi_bitmap_index_bit_in_field(bitmap_idx);
  const size_t mask = mi_bitmap_mask_(count, bitidx);
  mi_assert_internal(bitmap_fields > idx); MI_UNUSED(bitmap_fields);
  const size_t field = mi_atomic_load_relaxed(&bitmap[idx]);
  if (any_ones != NULL) { *any_ones = ((field & mask) != 0); }
  return ((field & mask) == mask);
}